

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkheader.c
# Opt level: O0

ktx_error_code_e ktxCheckHeader2_(KTX_header2 *pHeader,KTX_supplemental_info *pSuppInfo)

{
  _Bool _Var1;
  int iVar2;
  long in_RSI;
  void *in_RDI;
  ktx_uint32_t max_dim;
  ktx_uint8_t identifier_reference [12];
  uint local_34;
  uint local_30;
  uint local_2c;
  undefined8 local_24;
  undefined4 local_1c;
  long local_18;
  void *local_10;
  ktx_error_code_e local_4;
  
  local_24 = 0xbb30322058544bab;
  local_1c = 0xa1a0a0d;
  if ((in_RDI == (void *)0x0) || (in_RSI == 0)) {
    __assert_fail("pHeader != NULL && pSuppInfo != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/checkheader.c"
                  ,0xbe,"ktx_error_code_e ktxCheckHeader2_(KTX_header2 *, KTX_supplemental_info *)")
    ;
  }
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar2 = memcmp(in_RDI,&local_24,0xc);
  if (iVar2 == 0) {
    _Var1 = isProhibitedFormat(*(VkFormat *)((long)local_10 + 0xc));
    if (_Var1) {
      local_4 = KTX_FILE_DATA_ERROR;
    }
    else {
      _Var1 = isValidFormat(*(VkFormat *)((long)local_10 + 0xc));
      if (_Var1) {
        if ((*(int *)((long)local_10 + 0x2c) == 1) && (*(int *)((long)local_10 + 0xc) != 0)) {
          local_4 = KTX_FILE_DATA_ERROR;
        }
        else if ((*(int *)((long)local_10 + 0x14) == 0) ||
                ((*(int *)((long)local_10 + 0x1c) != 0 && (*(int *)((long)local_10 + 0x18) == 0))))
        {
          local_4 = KTX_FILE_DATA_ERROR;
        }
        else {
          if (*(int *)((long)local_10 + 0x1c) == 0) {
            if (*(int *)((long)local_10 + 0x18) == 0) {
              *(undefined2 *)(local_18 + 2) = 1;
            }
            else {
              *(undefined2 *)(local_18 + 2) = 2;
            }
          }
          else {
            if (*(int *)((long)local_10 + 0x20) != 0) {
              return KTX_UNSUPPORTED_FEATURE;
            }
            *(undefined2 *)(local_18 + 2) = 3;
          }
          if (*(int *)((long)local_10 + 0x24) == 6) {
            if (*(short *)(local_18 + 2) != 2) {
              return KTX_FILE_DATA_ERROR;
            }
            if (*(int *)((long)local_10 + 0x1c) != 0) {
              return KTX_FILE_DATA_ERROR;
            }
            if (*(int *)((long)local_10 + 0x14) != *(int *)((long)local_10 + 0x18)) {
              return KTX_FILE_DATA_ERROR;
            }
          }
          else if (*(int *)((long)local_10 + 0x24) != 1) {
            return KTX_FILE_DATA_ERROR;
          }
          if (*(int *)((long)local_10 + 0x28) == 0) {
            *(undefined1 *)(local_18 + 1) = 1;
            *(undefined4 *)((long)local_10 + 0x28) = 1;
          }
          else {
            *(undefined1 *)(local_18 + 1) = 0;
          }
          if (*(uint *)((long)local_10 + 0x2c) < 4) {
            if (*(uint *)((long)local_10 + 0x18) < *(uint *)((long)local_10 + 0x14)) {
              local_2c = *(uint *)((long)local_10 + 0x14);
            }
            else {
              local_2c = *(uint *)((long)local_10 + 0x18);
            }
            if (*(uint *)((long)local_10 + 0x1c) < local_2c) {
              if (*(uint *)((long)local_10 + 0x18) < *(uint *)((long)local_10 + 0x14)) {
                local_30 = *(uint *)((long)local_10 + 0x14);
              }
              else {
                local_30 = *(uint *)((long)local_10 + 0x18);
              }
              local_34 = local_30;
            }
            else {
              local_34 = *(uint *)((long)local_10 + 0x1c);
            }
            if (local_34 < (uint)(1 << ((char)*(undefined4 *)((long)local_10 + 0x28) - 1U & 0x1f)))
            {
              local_4 = KTX_FILE_DATA_ERROR;
            }
            else {
              local_4 = KTX_SUCCESS;
            }
          }
          else {
            local_4 = KTX_UNSUPPORTED_FEATURE;
          }
        }
      }
      else {
        local_4 = KTX_UNSUPPORTED_FEATURE;
      }
    }
  }
  else {
    local_4 = KTX_UNKNOWN_FILE_FORMAT;
  }
  return local_4;
}

Assistant:

KTX_error_code ktxCheckHeader2_(KTX_header2* pHeader,
                                KTX_supplemental_info* pSuppInfo)
{
// supp info is compressed, generateMipmaps and num dimensions. Don't need
// compressed as formatSize gives us that. I think the other 2 aren't needed.
    ktx_uint8_t identifier_reference[12] = KTX2_IDENTIFIER_REF;

    assert(pHeader != NULL && pSuppInfo != NULL);
    ktx_uint32_t max_dim;

    /* Compare identifier, is this a KTX file? */
    if (memcmp(pHeader->identifier, identifier_reference, 12) != 0)
    {
        return KTX_UNKNOWN_FILE_FORMAT;
    }

    /* Check format */
    if (isProhibitedFormat(pHeader->vkFormat))
    {
        return KTX_FILE_DATA_ERROR;
    }
    if (!isValidFormat(pHeader->vkFormat))
    {
        return KTX_UNSUPPORTED_FEATURE;
    }
    if (pHeader->supercompressionScheme == KTX_SS_BASIS_LZ && pHeader->vkFormat != VK_FORMAT_UNDEFINED)
    {
        return KTX_FILE_DATA_ERROR;
    }

    /* Check texture dimensions. KTX files can store 8 types of textures:
       1D, 2D, 3D, cube, and array variants of these. There is currently
       no extension for 3D array textures in any 3D API. */
    if ((pHeader->pixelWidth == 0) ||
        (pHeader->pixelDepth > 0 && pHeader->pixelHeight == 0))
    {
        /* texture must have width */
        /* texture must have height if it has depth */
        return KTX_FILE_DATA_ERROR;
    }

    if (pHeader->pixelDepth > 0)
    {
        if (pHeader->layerCount > 0)
        {
            /* No 3D array textures yet. */
            return KTX_UNSUPPORTED_FEATURE;
        }
        pSuppInfo->textureDimension = 3;
    }
    else if (pHeader->pixelHeight > 0)
    {
        pSuppInfo->textureDimension = 2;
    }
    else
    {
        pSuppInfo->textureDimension = 1;
    }

    if (pHeader->faceCount == 6)
    {
        if (pSuppInfo->textureDimension != 2)
        {
            /* cube map needs 2D faces */
            return KTX_FILE_DATA_ERROR;
        }
        if (pHeader->pixelDepth != 0)
        {
            /* cube map cannot have depth */
            return KTX_FILE_DATA_ERROR;
        }
        if (pHeader->pixelWidth != pHeader->pixelHeight)
        {
            /* cube map needs square faces */
            return KTX_FILE_DATA_ERROR;
        }
    }
    else if (pHeader->faceCount != 1)
    {
        /* numberOfFaces must be either 1 or 6 */
        return KTX_FILE_DATA_ERROR;
    }

    // Check number of mipmap levels
    if (pHeader->levelCount == 0)
    {
        pSuppInfo->generateMipmaps = 1;
        pHeader->levelCount = 1;
    }
    else
    {
        pSuppInfo->generateMipmaps = 0;
    }

    // Check supercompression
    switch (pHeader->supercompressionScheme) {
      case KTX_SS_NONE:
      case KTX_SS_BASIS_LZ:
      case KTX_SS_ZSTD:
      case KTX_SS_ZLIB:
        break;
      default:
        // Unsupported supercompression
        return KTX_UNSUPPORTED_FEATURE;
    }

    // This test works for arrays too because height or depth will be 0.
    max_dim = MAX(MAX(pHeader->pixelWidth, pHeader->pixelHeight), pHeader->pixelDepth);
    if (max_dim < ((ktx_uint32_t)1 << (pHeader->levelCount - 1)))
    {
        // Can't have more mip levels than 1 + log2(max(width, height, depth))
        return KTX_FILE_DATA_ERROR;
    }

    return KTX_SUCCESS;

}